

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBuildVisitor.h
# Opt level: O0

void __thiscall CBuildVisitor::~CBuildVisitor(CBuildVisitor *this)

{
  CBuildVisitor *this_local;
  
  (this->super_IVisitor)._vptr_IVisitor = (_func_int **)&PTR_Visit_00238560;
  std::
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>_>_>
  ::~shared_ptr(&this->treesOfMethods);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CFrame,_std::default_delete<const_IRT::CFrame>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_IRT::CFrame,_std::default_delete<const_IRT::CFrame>_>_>_>_>
  ::~map(&this->frames);
  std::__cxx11::string::~string((string *)&this->currentObjectClassName);
  std::__cxx11::string::~string((string *)&this->currentMethod);
  std::__cxx11::string::~string((string *)&this->currentClassName);
  std::unique_ptr<IRT::ISubtreeWrapper,_std::default_delete<IRT::ISubtreeWrapper>_>::~unique_ptr
            (&this->wrapper);
  return;
}

Assistant:

CBuildVisitor( const SymbolTable *table )
            : symbolTable( table ), treesOfMethods( std::move(std::unique_ptr<MethodToIRTMap>(new MethodToIRTMap()))) {}